

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectrum.cpp
# Opt level: O2

string * __thiscall
pbrt::PiecewiseLinearSpectrum::ToString_abi_cxx11_
          (string *__return_storage_ptr__,PiecewiseLinearSpectrum *this)

{
  allocator<char> local_71;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"[ PiecewiseLinearSpectrum ",&local_71);
  ParameterString_abi_cxx11_(&local_70,this);
  std::operator+(&local_30,&local_50,&local_70);
  std::operator+(__return_storage_ptr__,&local_30," ]");
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  return __return_storage_ptr__;
}

Assistant:

std::string PiecewiseLinearSpectrum::ToString() const {
    return std::string("[ PiecewiseLinearSpectrum ") + ParameterString() + " ]";
}